

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall Network::applyMiniBatch(Network *this)

{
  Matrix *this_00;
  Matrix *input;
  size_t local_18;
  size_t i;
  Network *this_local;
  
  local_18 = this->layerCount;
  while (local_18 = local_18 - 1, local_18 != 0) {
    this_00 = Matrix::multiply(this->layers[local_18]->deltaWeightSum,this->learningRate);
    input = Matrix::multiply(this->layers[local_18]->previousDeltaWeight,this->momentum);
    Matrix::add(this_00,input);
    ArrayHelper::multiply
              (this->layers[local_18]->deltaBiasSum,this->learningRate,
               this->layers[local_18]->nodeCount);
    ArrayHelper::multiply
              (this->layers[local_18]->previousDeltaBias,this->momentum,
               this->layers[local_18]->nodeCount);
    ArrayHelper::add(this->layers[local_18]->deltaBiasSum,this->layers[local_18]->previousDeltaBias,
                     this->layers[local_18]->nodeCount);
    Matrix::moveData(this->layers[local_18]->previousDeltaWeight,
                     this->layers[local_18]->deltaWeightSum);
    ArrayHelper::copy((ArrayHelper *)this->layers[local_18]->deltaBiasSum,
                      (EVP_PKEY_CTX *)this->layers[local_18]->previousDeltaBias,
                      (EVP_PKEY_CTX *)this->layers[local_18]->nodeCount);
    Matrix::subtract(this->layers[local_18]->weights,this->layers[local_18]->deltaWeightSum);
    ArrayHelper::subtract
              (this->layers[local_18]->biases,this->layers[local_18]->deltaBiasSum,
               this->layers[local_18]->nodeCount);
    Matrix::zero(this->layers[local_18]->deltaWeightSum);
    ArrayHelper::zero(this->layers[local_18]->deltaBiasSum,this->layers[local_18]->nodeCount);
  }
  this->batchTrained = 0;
  return;
}

Assistant:

void Network::applyMiniBatch() {
		for (size_t i = layerCount - 1; i > 0; i--) {
			/* Mutliply Learning Rate + momentum with Formula
			 * delta = previousDelta * momentum + learningRate * ∇Loss
			 */
			layers[i]->deltaWeightSum
				->multiply(learningRate)
				->add(layers[i]->previousDeltaWeight->multiply(momentum));

			ArrayHelper::multiply(layers[i]->deltaBiasSum, learningRate, layers[i]->nodeCount);
			ArrayHelper::multiply(layers[i]->previousDeltaBias, momentum, layers[i]->nodeCount);
			ArrayHelper::add(layers[i]->deltaBiasSum, layers[i]->previousDeltaBias, layers[i]->nodeCount);

			/* Delete last previous deltas and set the new one (momentum optimization) */
			Matrix::moveData(layers[i]->previousDeltaWeight, layers[i]->deltaWeightSum);
			ArrayHelper::copy(layers[i]->deltaBiasSum, layers[i]->previousDeltaBias, layers[i]->nodeCount);

			/* Adjust calculated batch data for weights and biases */
			layers[i]->weights->subtract(layers[i]->deltaWeightSum);
			ArrayHelper::subtract(layers[i]->biases, layers[i]->deltaBiasSum, layers[i]->nodeCount);

			/* Set calculated batch to zero again*/
			layers[i]->deltaWeightSum->zero();
			ArrayHelper::zero(layers[i]->deltaBiasSum, layers[i]->nodeCount);
		}
		batchTrained = 0;
}